

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall aiNode::addChildren(aiNode *this,uint numChildren,aiNode **children)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__dest;
  aiNode **ppaVar3;
  uint local_3c;
  uint i_1;
  aiNode **tmp;
  aiNode *child;
  uint i;
  aiNode **children_local;
  uint numChildren_local;
  aiNode *this_local;
  
  if ((children != (aiNode **)0x0) && (numChildren != 0)) {
    for (child._4_4_ = 0; child._4_4_ < numChildren; child._4_4_ = child._4_4_ + 1) {
      if (children[child._4_4_] != (aiNode *)0x0) {
        children[child._4_4_]->mParent = this;
      }
    }
    if (this->mNumChildren == 0) {
      uVar2 = SUB168(ZEXT416(numChildren) * ZEXT816(8),0);
      if (SUB168(ZEXT416(numChildren) * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      ppaVar3 = (aiNode **)operator_new__(uVar2);
      this->mChildren = ppaVar3;
      for (local_3c = 0; local_3c < numChildren; local_3c = local_3c + 1) {
        this->mChildren[local_3c] = children[local_3c];
      }
      this->mNumChildren = numChildren;
    }
    else {
      auVar1 = ZEXT416(this->mNumChildren) * ZEXT816(8);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      __dest = operator_new__(uVar2);
      memcpy(__dest,this->mChildren,(ulong)this->mNumChildren << 3);
      if (this->mChildren != (aiNode **)0x0) {
        operator_delete__(this->mChildren);
      }
      auVar1 = ZEXT416(this->mNumChildren + numChildren) * ZEXT816(8);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      ppaVar3 = (aiNode **)operator_new__(uVar2);
      this->mChildren = ppaVar3;
      memcpy(this->mChildren,__dest,(ulong)this->mNumChildren << 3);
      memcpy(this->mChildren + this->mNumChildren,children,(ulong)numChildren << 3);
      this->mNumChildren = numChildren + this->mNumChildren;
      if (__dest != (void *)0x0) {
        operator_delete__(__dest);
      }
    }
  }
  return;
}

Assistant:

void aiNode::addChildren(unsigned int numChildren, aiNode **children) {
    if (nullptr == children || 0 == numChildren) {
        return;
    }

    for (unsigned int i = 0; i < numChildren; i++) {
        aiNode *child = children[i];
        if (nullptr != child) {
            child->mParent = this;
        }
    }

    if (mNumChildren > 0) {
        aiNode **tmp = new aiNode*[mNumChildren];
        ::memcpy(tmp, mChildren, sizeof(aiNode*) * mNumChildren);
        delete[] mChildren;
        mChildren = new aiNode*[mNumChildren + numChildren];
        ::memcpy(mChildren, tmp, sizeof(aiNode*) * mNumChildren);
        ::memcpy(&mChildren[mNumChildren], children, sizeof(aiNode*)* numChildren);
        mNumChildren += numChildren;
        delete[] tmp;
    }
    else {
        mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; i++) {
            mChildren[i] = children[i];
        }
        mNumChildren = numChildren;
    }
}